

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

bool __thiscall
el::base::utils::
AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
::operator!=(AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
             *this,AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                   *other)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined1 uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 extraout_RAX;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  undefined8 *puVar12;
  bool bVar13;
  undefined8 uVar7;
  
  iVar5 = (*(this->super_ThreadSafe)._vptr_ThreadSafe[10])();
  iVar6 = (*(other->super_ThreadSafe)._vptr_ThreadSafe[10])(other);
  bVar13 = true;
  if (CONCAT44(extraout_var,iVar5) == CONCAT44(extraout_var_00,iVar6)) {
    lVar8 = *(long *)&this->field_0x18 - *(long *)&this->m_list;
    bVar13 = lVar8 != 0;
    if (bVar13) {
      uVar9 = lVar8 >> 3;
      lVar8 = *(long *)&other->field_0x18 - *(long *)&other->m_list >> 3;
      uVar11 = 1;
      do {
        if (uVar11 - lVar8 == 1) {
          pcVar10 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
          uVar7 = ::std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,lVar8);
          uVar4 = (undefined1)uVar7;
          puVar2 = *(undefined8 **)pcVar10;
          puVar3 = *(undefined8 **)((long)pcVar10 + 8);
          puVar12 = puVar2;
          if (puVar3 != puVar2) {
            do {
              if ((undefined8 *)*puVar12 != puVar12 + 2) {
                operator_delete((undefined8 *)*puVar12);
                uVar7 = extraout_RAX;
              }
              uVar4 = (undefined1)uVar7;
              puVar12 = puVar12 + 4;
            } while (puVar12 != puVar3);
            *(undefined8 **)((long)pcVar10 + 8) = puVar2;
          }
          return (bool)uVar4;
        }
        if (*(long *)(*(long *)&this->m_list + -8 + uVar11 * 8) !=
            *(long *)(*(long *)&other->m_list + -8 + uVar11 * 8)) {
          return bVar13;
        }
        bVar13 = uVar11 < uVar9;
        lVar1 = (-(ulong)(uVar9 == 0) - uVar9) + uVar11;
        uVar11 = uVar11 + 1;
      } while (lVar1 != 0);
    }
  }
  return bVar13;
}

Assistant:

bool operator!=(const AbstractRegistry<T_Ptr, Container>& other) {
    if (size() != other.size()) {
      return true;
    }
    for (std::size_t i = 0; i < m_list.size(); ++i) {
      if (m_list.at(i) != other.m_list.at(i)) {
        return true;
      }
    }
    return false;
  }